

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>_>_>
              *this)

{
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>::~for_all_elements()::_lambda(std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>*)_1_>
            (&this->arrays,(anon_class_8_1_8991fb9c)this);
  delete_arrays(this,&this->arrays);
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }